

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O2

int jpc_dec_cp_setfromqcc(jpc_dec_cp_t *cp,jpc_qcc_t *qcc)

{
  int iVar1;
  int in_ECX;
  
  iVar1 = jpc_dec_cp_setfromqcx
                    ((jpc_dec_cp_t *)(cp->ccps + qcc->compno),(jpc_dec_ccp_t *)&qcc->compparms,
                     (jpc_qcxcp_t *)0x8,in_ECX);
  return iVar1;
}

Assistant:

static int jpc_dec_cp_setfromqcc(jpc_dec_cp_t *cp, jpc_qcc_t *qcc)
{
	return jpc_dec_cp_setfromqcx(cp, &cp->ccps[qcc->compno], &qcc->compparms, JPC_QCC);
}